

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void indexedX0p_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_m680x_op *op;
  
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  op = (info->m680x).operands + bVar2;
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  *(undefined8 *)&(info->m680x).operands[bVar2].field_1 = 0xd;
  *(undefined2 *)((long)&(info->m680x).operands[bVar2].field_1 + 0xc) = 0x100;
  puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
  *puVar1 = *puVar1 | 6;
  return;
}

Assistant:

static void indexedX0p_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	add_indexed_operand(info, M680X_REG_X, true, 1, M680X_OFFSET_NONE,
		0, true);
}